

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void bc_slist_free_full(bc_slist_t *l,bc_free_func_t free_func)

{
  _bc_slist_t *p_Var1;
  
  if (l != (bc_slist_t *)0x0) {
    do {
      p_Var1 = l->next;
      if ((free_func != (bc_free_func_t)0x0) && (l->data != (void *)0x0)) {
        (*free_func)(l->data);
      }
      free(l);
      l = p_Var1;
    } while (p_Var1 != (_bc_slist_t *)0x0);
  }
  return;
}

Assistant:

void
bc_slist_free_full(bc_slist_t *l, bc_free_func_t free_func)
{
    while (l != NULL) {
        bc_slist_t *tmp = l->next;
        if ((free_func != NULL) && (l->data != NULL))
            free_func(l->data);
        free(l);
        l = tmp;
    }
}